

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# age.cpp
# Opt level: O2

void duckdb::AgeFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  interval_t *piVar3;
  UnifiedVectorFormat *count;
  long lVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar9;
  UnifiedVectorFormat *pUVar10;
  long lVar11;
  int64_t *piVar12;
  ulong uVar13;
  ulong uVar14;
  VectorType VVar15;
  UnifiedVectorFormat *pUVar16;
  TemplatedValidityMask<unsigned_long> *pTVar17;
  interval_t iVar18;
  int64_t *local_100;
  long *local_c0;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat ldata;
  long local_70;
  long local_68;
  
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,1);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar15 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar15);
    piVar3 = *(interval_t **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      iVar18 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                         (**(undefined8 **)(vector + 0x20),**(undefined8 **)(vector_00 + 0x20),
                          result + 0x28,0);
      *piVar3 = iVar18;
      return;
    }
  }
  else {
    count = *(UnifiedVectorFormat **)(input + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      lVar4 = *(long *)(vector + 0x20);
      puVar5 = *(undefined8 **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar15);
        lVar11 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pTVar17 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
        FlatVector::VerifyFlatVector(vector);
        TemplatedValidityMask<unsigned_long>::Copy
                  (pTVar17,(TemplatedValidityMask<unsigned_long> *)(vector + 0x28),(idx_t)count);
        if (*(long *)(result + 0x28) == 0) {
          piVar12 = (int64_t *)(lVar11 + 8);
          for (pUVar16 = (UnifiedVectorFormat *)0x0; count != pUVar16; pUVar16 = pUVar16 + 1) {
            iVar18 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                               (*(undefined8 *)(lVar4 + (long)pUVar16 * 8),*puVar5,pTVar17,pUVar16);
            piVar12[-1] = iVar18._0_8_;
            *piVar12 = iVar18.micros;
            piVar12 = piVar12 + 2;
          }
          return;
        }
        lVar11 = lVar11 + 8;
        uVar14 = 0;
        pUVar16 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar14 == (ulong)(count + 0x3f) >> 6) {
            return;
          }
          if (pTVar17->validity_mask == (unsigned_long *)0x0) {
            pUVar9 = pUVar16 + 0x40;
            if (count <= pUVar16 + 0x40) {
              pUVar9 = count;
            }
LAB_00682844:
            piVar12 = (int64_t *)((long)pUVar16 * 0x10 + lVar11);
            for (; pUVar10 = pUVar16, pUVar16 < pUVar9; pUVar16 = pUVar16 + 1) {
              iVar18 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                 (*(undefined8 *)(lVar4 + (long)pUVar16 * 8),*puVar5,pTVar17,pUVar16
                                 );
              piVar12[-1] = iVar18._0_8_;
              *piVar12 = iVar18.micros;
              piVar12 = piVar12 + 2;
            }
          }
          else {
            uVar6 = pTVar17->validity_mask[uVar14];
            pUVar9 = pUVar16 + 0x40;
            if (count <= pUVar16 + 0x40) {
              pUVar9 = count;
            }
            if (uVar6 == 0xffffffffffffffff) goto LAB_00682844;
            pUVar10 = pUVar9;
            if (uVar6 != 0) {
              piVar12 = (int64_t *)((long)pUVar16 * 0x10 + lVar11);
              for (uVar13 = 0; pUVar10 = pUVar16 + uVar13, pUVar16 + uVar13 < pUVar9;
                  uVar13 = uVar13 + 1) {
                if ((uVar6 >> (uVar13 & 0x3f) & 1) != 0) {
                  iVar18 = BinaryLambdaWrapperWithNulls::
                           Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                     (*(undefined8 *)(lVar4 + (long)pUVar16 * 8 + uVar13 * 8),
                                      *puVar5,pTVar17);
                  piVar12[-1] = iVar18._0_8_;
                  *piVar12 = iVar18.micros;
                }
                piVar12 = piVar12 + 2;
              }
            }
          }
          uVar14 = uVar14 + 1;
          pUVar16 = pUVar10;
        } while( true );
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          lVar11 = *(long *)(vector + 0x20);
          lVar7 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar15);
          lVar4 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          pTVar17 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
          FlatVector::VerifyFlatVector(vector);
          TemplatedValidityMask<unsigned_long>::Copy
                    (pTVar17,(TemplatedValidityMask<unsigned_long> *)(vector + 0x28),(idx_t)count);
          lVar8 = *(long *)(result + 0x28);
          FlatVector::VerifyFlatVector(vector_00);
          if (lVar8 == 0) {
            TemplatedValidityMask<unsigned_long>::Copy
                      (pTVar17,(TemplatedValidityMask<unsigned_long> *)(vector_00 + 0x28),
                       (idx_t)count);
          }
          else {
            duckdb::ValidityMask::Combine((ValidityMask *)pTVar17,(ulong)(vector_00 + 0x28));
          }
          if (pTVar17->validity_mask == (unsigned_long *)0x0) {
            local_100 = (int64_t *)(lVar4 + 8);
            for (pUVar16 = (UnifiedVectorFormat *)0x0; count != pUVar16; pUVar16 = pUVar16 + 1) {
              iVar18 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                 (*(undefined8 *)(lVar11 + (long)pUVar16 * 8),
                                  *(undefined8 *)(lVar7 + (long)pUVar16 * 8),pTVar17,pUVar16);
              local_100[-1] = iVar18._0_8_;
              *local_100 = iVar18.micros;
              local_100 = local_100 + 2;
            }
          }
          else {
            lVar4 = lVar4 + 8;
            pUVar16 = (UnifiedVectorFormat *)0x0;
            for (uVar14 = 0; uVar14 != (ulong)(count + 0x3f) >> 6; uVar14 = uVar14 + 1) {
              if (pTVar17->validity_mask == (unsigned_long *)0x0) {
                pUVar9 = pUVar16 + 0x40;
                if (count <= pUVar16 + 0x40) {
                  pUVar9 = count;
                }
LAB_00682df6:
                piVar12 = (int64_t *)((long)pUVar16 * 0x10 + lVar4);
                for (; pUVar10 = pUVar16, pUVar16 < pUVar9; pUVar16 = pUVar16 + 1) {
                  iVar18 = BinaryLambdaWrapperWithNulls::
                           Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                     (*(undefined8 *)(lVar11 + (long)pUVar16 * 8),
                                      *(undefined8 *)(lVar7 + (long)pUVar16 * 8),pTVar17,pUVar16);
                  piVar12[-1] = iVar18._0_8_;
                  *piVar12 = iVar18.micros;
                  piVar12 = piVar12 + 2;
                }
              }
              else {
                uVar6 = pTVar17->validity_mask[uVar14];
                pUVar9 = pUVar16 + 0x40;
                if (count <= pUVar16 + 0x40) {
                  pUVar9 = count;
                }
                if (uVar6 == 0xffffffffffffffff) goto LAB_00682df6;
                pUVar10 = pUVar9;
                if (uVar6 != 0) {
                  piVar12 = (int64_t *)((long)pUVar16 * 0x10 + lVar4);
                  for (uVar13 = 0; pUVar10 = pUVar16 + uVar13, pUVar16 + uVar13 < pUVar9;
                      uVar13 = uVar13 + 1) {
                    if ((uVar6 >> (uVar13 & 0x3f) & 1) != 0) {
                      iVar18 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                         (*(undefined8 *)(lVar11 + (long)pUVar16 * 8 + uVar13 * 8),
                                          *(undefined8 *)(lVar7 + (long)pUVar16 * 8 + uVar13 * 8),
                                          pTVar17);
                      piVar12[-1] = iVar18._0_8_;
                      *piVar12 = iVar18.micros;
                    }
                    piVar12 = piVar12 + 2;
                  }
                }
              }
              pUVar16 = pUVar10;
            }
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,count);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,count);
          duckdb::Vector::SetVectorType(VVar15);
          lVar4 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          pTVar17 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
          if (local_b0 == 0 && local_68 == 0) {
            piVar12 = (int64_t *)(lVar4 + 8);
            for (pUVar16 = (UnifiedVectorFormat *)0x0; count != pUVar16; pUVar16 = pUVar16 + 1) {
              pUVar9 = pUVar16;
              if (*_ldata != 0) {
                pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar16 * 4);
              }
              pUVar10 = pUVar16;
              if (*local_c0 != 0) {
                pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar16 * 4);
              }
              iVar18 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                 (*(undefined8 *)(local_70 + (long)pUVar9 * 8),
                                  *(undefined8 *)(local_b8 + (long)pUVar10 * 8),pTVar17,pUVar16);
              piVar12[-1] = iVar18._0_8_;
              *piVar12 = iVar18.micros;
              piVar12 = piVar12 + 2;
            }
          }
          else {
            piVar12 = (int64_t *)(lVar4 + 8);
            for (pUVar16 = (UnifiedVectorFormat *)0x0; count != pUVar16; pUVar16 = pUVar16 + 1) {
              pUVar9 = pUVar16;
              if (*_ldata != 0) {
                pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar16 * 4);
              }
              pUVar10 = pUVar16;
              if (*local_c0 != 0) {
                pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar16 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar9 >> 6) * 8) >> ((ulong)pUVar9 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar10 >> 6) * 8) >> ((ulong)pUVar10 & 0x3f) & 1)
                   != 0)))) {
                iVar18 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                   (*(undefined8 *)(local_70 + (long)pUVar9 * 8),
                                    *(undefined8 *)(local_b8 + (long)pUVar10 * 8),pTVar17,pUVar16);
                piVar12[-1] = iVar18._0_8_;
                *piVar12 = iVar18.micros;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid(pTVar17,(idx_t)pUVar16);
              }
              piVar12 = piVar12 + 2;
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      puVar5 = *(undefined8 **)(vector + 0x20);
      lVar4 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar15);
        lVar11 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        pTVar17 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
        FlatVector::VerifyFlatVector(vector_00);
        TemplatedValidityMask<unsigned_long>::Copy
                  (pTVar17,(TemplatedValidityMask<unsigned_long> *)(vector_00 + 0x28),(idx_t)count);
        if (*(long *)(result + 0x28) == 0) {
          piVar12 = (int64_t *)(lVar11 + 8);
          for (pUVar16 = (UnifiedVectorFormat *)0x0; count != pUVar16; pUVar16 = pUVar16 + 1) {
            iVar18 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                               (*puVar5,*(undefined8 *)(lVar4 + (long)pUVar16 * 8),pTVar17,pUVar16);
            piVar12[-1] = iVar18._0_8_;
            *piVar12 = iVar18.micros;
            piVar12 = piVar12 + 2;
          }
          return;
        }
        lVar11 = lVar11 + 8;
        uVar14 = 0;
        pUVar16 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar14 == (ulong)(count + 0x3f) >> 6) {
            return;
          }
          if (pTVar17->validity_mask == (unsigned_long *)0x0) {
            pUVar9 = pUVar16 + 0x40;
            if (count <= pUVar16 + 0x40) {
              pUVar9 = count;
            }
LAB_00682af1:
            piVar12 = (int64_t *)((long)pUVar16 * 0x10 + lVar11);
            for (; pUVar10 = pUVar16, pUVar16 < pUVar9; pUVar16 = pUVar16 + 1) {
              iVar18 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                 (*puVar5,*(undefined8 *)(lVar4 + (long)pUVar16 * 8),pTVar17,pUVar16
                                 );
              piVar12[-1] = iVar18._0_8_;
              *piVar12 = iVar18.micros;
              piVar12 = piVar12 + 2;
            }
          }
          else {
            uVar6 = pTVar17->validity_mask[uVar14];
            pUVar9 = pUVar16 + 0x40;
            if (count <= pUVar16 + 0x40) {
              pUVar9 = count;
            }
            if (uVar6 == 0xffffffffffffffff) goto LAB_00682af1;
            pUVar10 = pUVar9;
            if (uVar6 != 0) {
              piVar12 = (int64_t *)((long)pUVar16 * 0x10 + lVar11);
              for (uVar13 = 0; pUVar10 = pUVar16 + uVar13, pUVar16 + uVar13 < pUVar9;
                  uVar13 = uVar13 + 1) {
                if ((uVar6 >> (uVar13 & 0x3f) & 1) != 0) {
                  iVar18 = BinaryLambdaWrapperWithNulls::
                           Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                     (*puVar5,*(undefined8 *)
                                               (lVar4 + (long)pUVar16 * 8 + uVar13 * 8),pTVar17);
                  piVar12[-1] = iVar18._0_8_;
                  *piVar12 = iVar18.micros;
                }
                piVar12 = piVar12 + 2;
              }
            }
          }
          uVar14 = uVar14 + 1;
          pUVar16 = pUVar10;
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar15);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void AgeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	D_ASSERT(input.ColumnCount() == 2);

	BinaryExecutor::ExecuteWithNulls<timestamp_t, timestamp_t, interval_t>(
	    input.data[0], input.data[1], result, input.size(),
	    [&](timestamp_t input1, timestamp_t input2, ValidityMask &mask, idx_t idx) {
		    if (Timestamp::IsFinite(input1) && Timestamp::IsFinite(input2)) {
			    return Interval::GetAge(input1, input2);
		    } else {
			    mask.SetInvalid(idx);
			    return interval_t();
		    }
	    });
}